

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  Curl_easy *pCVar2;
  curl_ssl_ctx_callback p_Var3;
  Curl_chunker *pCVar4;
  proxy_info *ppVar5;
  ssl_config_data *psVar6;
  ssl_config_data *psVar7;
  Curl_easy *__cp;
  _Bool *p_Var8;
  byte bVar9;
  _Bool _Var10;
  int iVar11;
  CURLcode CVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  curl_proxytype cVar17;
  uint uVar18;
  CURLcode CVar19;
  time_t timeout_ms;
  SSL_CIPHER *c;
  char *pcVar20;
  timediff_t tVar21;
  uint *puVar22;
  SSL_METHOD *meth;
  SSL_CTX *pSVar23;
  ulong uVar24;
  long lVar25;
  BIO_METHOD *pBVar26;
  BIO *pBVar27;
  stack_st_X509 *psVar28;
  X509 *pXVar29;
  X509_NAME *pXVar30;
  size_t sVar31;
  undefined8 uVar32;
  ASN1_INTEGER *pAVar33;
  ASN1_STRING *pAVar34;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar35;
  EVP_PKEY *pEVar36;
  char **ppcVar37;
  GENERAL_NAMES *a_00;
  int *piVar38;
  Curl_easy *pCVar39;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  void *__src;
  PKCS12 *p12;
  UI_METHOD *method;
  UI_METHOD *pUVar40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSL *pSVar41;
  evp_pkey_st *peVar42;
  rsa_st *r;
  size_t uznum;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar43;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar44;
  OCSP_SINGLERESP *single;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  undefined8 *puVar45;
  long lVar46;
  ssl_primary_config *psVar47;
  EVP_PKEY *pEVar48;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar49;
  size_t size;
  char **ppcVar50;
  size_t size_00;
  char *pcVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  curl_socket_t readfd0;
  ENGINE *e;
  long lVar55;
  long lVar56;
  long lVar57;
  Curl_easy *pCVar58;
  long lVar59;
  bool bVar60;
  Curl_easy *pCVar61;
  bool bVar62;
  Curl_easy *local_c80;
  char *ptr;
  Curl_easy *local_c60;
  Curl_easy *local_c58;
  stack_st_X509 *local_c50;
  char *local_c48;
  BIO *local_c40;
  SSL_CTX *local_c38;
  Curl_easy *local_c30;
  X509 *x509;
  EVP_PKEY *local_c20;
  Curl_easy *local_c18;
  X509_ALGOR *palg;
  BIO *local_c08;
  long local_c00;
  ASN1_BIT_STRING *psig;
  uint local_bec;
  _Bool *local_be8;
  X509 *local_be0;
  long local_bd8;
  char *local_bd0;
  stack_st_X509 *local_bc8;
  char *local_bc0;
  in6_addr addr;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  char error_buffer_1 [256];
  
  local_c40 = (BIO *)CONCAT44(local_c40._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
  lVar59 = (long)sockindex;
  pCVar61 = (Curl_easy *)(lVar59 * 0x18);
  if (conn->ssl[lVar59].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar39 = conn->data;
  pCVar4 = &conn->chunk;
  local_c48 = (char *)CONCAT44(local_c48._4_4_,conn->sock[lVar59]);
  iVar11 = *(int *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8));
  p_Var8 = done;
  if (iVar11 == 0) {
    tVar21 = Curl_timeleft(pCVar39,(curltime *)0x0,true);
    if (tVar21 < 0) {
LAB_00419222:
      Curl_failf(pCVar39,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pXVar29 = (X509 *)(conn->sock + lVar59);
    pCVar2 = conn->data;
    local_c00 = CONCAT44(local_c00._4_4_,sockindex);
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      local_c60 = (Curl_easy *)(conn->http_proxy).host.name;
      lVar25 = 0xb48;
      lVar46 = 0x3a0;
      lVar54 = 0x368;
      lVar49 = 0x370;
      lVar57 = 0xb70;
      lVar55 = 0xb68;
      lVar56 = 0x358;
      lVar52 = 0xb40;
    }
    else {
      local_c60 = (Curl_easy *)(conn->host).name;
      lVar25 = 0xaa0;
      lVar46 = 0x350;
      lVar54 = 0x318;
      lVar49 = 800;
      lVar57 = 0xac8;
      lVar55 = 0xac0;
      lVar56 = 0x308;
      lVar52 = 0xa98;
    }
    iVar13 = *(int *)&pXVar29->cert_info;
    local_c20 = *(EVP_PKEY **)((conn->chunk).hexbuffer + lVar54 + -0x20);
    local_c50 = *(stack_st_X509 **)((long)&pCVar2->next + lVar57);
    uVar24 = *(ulong *)((conn->chunk).hexbuffer + lVar56 + -0x20);
    local_c80 = *(Curl_easy **)((long)&pCVar2->next + lVar55);
    pBVar27 = *(BIO **)((conn->chunk).hexbuffer + lVar49 + -0x20);
    bVar9 = (conn->chunk).hexbuffer[lVar46 + -0x20];
    pcVar51 = *(char **)((long)&pCVar2->next + lVar25);
    local_c30 = pCVar39;
    local_c18 = pCVar61;
    local_be8 = done;
    local_bd8 = lVar59;
    CVar12 = Curl_ossl_seed(pCVar2);
    if (CVar12 != CURLE_OK) {
      return CVar12;
    }
    *(undefined8 *)((long)&pCVar2->next + lVar52) = 1;
    local_c08 = pBVar27;
    local_be0 = pXVar29;
    if (7 < uVar24) {
      Curl_failf(pCVar2,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    if ((0xf3UL >> (uVar24 & 0x3f) & 1) == 0) {
      if (uVar24 == 2) {
        pcVar51 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar51 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar2,pcVar51);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar23 = (SSL_CTX *)
              **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8));
    if (pSVar23 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar23);
    }
    pSVar23 = SSL_CTX_new(meth);
    pCVar58 = local_c18;
    **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) = pSVar23;
    if (pSVar23 == (SSL_CTX *)0x0) {
      uVar24 = ERR_peek_error();
      ERR_error_string_n(uVar24,error_buffer,0x100);
      Curl_failf(pCVar2,"SSL: couldn\'t create a context: %s",error_buffer);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar23,0x21,0x10,(void *)0x0);
    if (((pCVar2->set).fdebug != (curl_debug_callback)0x0) &&
       (((pCVar2->set).field_0x87b & 0x40) != 0)) {
      SSL_CTX_set_msg_callback
                ((SSL_CTX *)
                 **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                 ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)
                   **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),0x10
                   ,0,conn);
    }
    pCVar39 = local_c30;
    local_bec = bVar9 & 1;
    uVar53 = 0x80024850;
    cVar17 = (conn->http_proxy).proxytype;
    if ((cVar17 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar9 = (pCVar2->set).proxy_ssl.field_0xa0;
    }
    else {
      bVar9 = (pCVar2->set).ssl.field_0xa0;
    }
    if ((bVar9 & 4) == 0) {
      uVar53 = 0x80024050;
    }
    if ((0xf3UL >> (uVar24 & 0x3f) & 1) == 0) {
      if (uVar24 == 2) {
        uVar24 = uVar53 | 0x3e000000;
      }
      else {
        uVar24 = uVar53 | 0x3c000000;
      }
    }
    else {
      if (cVar17 == CURLPROXY_HTTPS) {
        bVar62 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        psVar47 = &conn->proxy_ssl_config;
        if (bVar62) {
          psVar47 = &conn->ssl_config;
        }
        lVar59 = 0x360;
        if (bVar62) {
          lVar59 = 0x310;
        }
      }
      else {
        psVar47 = &conn->ssl_config;
        lVar59 = 0x310;
      }
      uVar24 = uVar53 | 0x2000000;
      lVar25 = psVar47->version;
      lVar59 = *(long *)((conn->chunk).hexbuffer + lVar59 + -0x20);
      if (lVar25 == 5) {
LAB_00419650:
        uVar24 = uVar24 | 0x4000000;
      }
      else {
        if (lVar25 == 6) {
LAB_00419649:
          uVar24 = uVar24 | 0x10000000;
          goto LAB_00419650;
        }
        if (lVar25 == 7) {
          SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)((long)&conn->ssl[0].backend + (long)pCVar58),
                       0x7c,0x304,(void *)0x0);
          uVar24 = uVar53 | 0xa000000;
          goto LAB_00419649;
        }
      }
      if (lVar59 != 0x60000) {
        if (lVar59 != 0x50000) {
          if (lVar59 != 0x40000) goto LAB_0041a6a6;
          uVar24 = uVar24 | 0x10000000;
        }
        uVar24 = uVar24 | 0x8000000;
      }
      uVar24 = uVar24 | 0x20000000;
    }
LAB_0041a6a6:
    SSL_CTX_set_options(**(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8))
                        ,uVar24);
    uVar16 = *(uint *)&(conn->bits).field_0x4;
    if ((uVar16 >> 0x1c & 1) != 0) {
      SSL_CTX_set_next_proto_select_cb
                ((SSL_CTX *)
                 **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                 select_next_proto_cb,conn);
      uVar16 = *(uint *)&(conn->bits).field_0x4;
    }
    if ((uVar16 >> 0x1d & 1) != 0) {
      builtin_strncpy(error_buffer_1,"\bhttp/1.1",9);
      Curl_infof(pCVar2,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos
                (**(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                 error_buffer_1,9);
    }
    if (local_c80 != (Curl_easy *)0x0 || local_c50 != (stack_st_X509 *)0x0) {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        psVar6 = &(pCVar2->set).ssl;
        psVar7 = &(pCVar2->set).ssl;
        bVar62 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar62) {
          psVar7 = &(pCVar2->set).proxy_ssl;
          psVar6 = &(pCVar2->set).proxy_ssl;
        }
        ppcVar37 = &psVar6->key;
        ppcVar50 = &psVar7->key_type;
        lVar59 = 0xb88;
        if (bVar62) {
          lVar59 = 0xae0;
        }
      }
      else {
        ppcVar37 = &(pCVar2->set).ssl.key;
        ppcVar50 = &(pCVar2->set).ssl.key_type;
        lVar59 = 0xae0;
      }
      local_c38 = (SSL_CTX *)
                  **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8));
      local_bc8 = (stack_st_X509 *)*ppcVar37;
      local_bd0 = *ppcVar50;
      psVar28 = *(stack_st_X509 **)((long)&pCVar2->next + lVar59);
      local_c58 = conn->data;
      iVar11 = do_file_type((char *)local_c50);
      pSVar23 = local_c38;
      if (iVar11 == 0x2a || local_c80 != (Curl_easy *)0x0) {
        if (psVar28 != (stack_st_X509 *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(local_c38,psVar28);
          SSL_CTX_set_default_passwd_cb(pSVar23,passwd_callback);
        }
        pCVar39 = local_c58;
        if (iVar11 == 0x2b) {
          ptr = (char *)0x0;
          local_c50 = psVar28;
          pBVar26 = BIO_s_file();
          pBVar27 = BIO_new(pBVar26);
          if (pBVar27 != (BIO *)0x0) {
            lVar59 = BIO_ctrl(pBVar27,0x6c,3,local_c80);
            if ((int)lVar59 < 1) {
              Curl_failf(local_c58,"could not open PKCS12 file \'%s\'",local_c80);
              BIO_free(pBVar27);
              return CURLE_SSL_CERTPROBLEM;
            }
            p12 = d2i_PKCS12_bio(pBVar27,(PKCS12 **)0x0);
            BIO_free(pBVar27);
            if (p12 == (PKCS12 *)0x0) {
              pcVar51 = "error reading PKCS12 file \'%s\'";
              pCVar39 = local_c58;
              goto LAB_0041ac62;
            }
            PKCS12_PBE_add();
            iVar15 = PKCS12_parse(p12,(char *)local_c50,(EVP_PKEY **)&params,(X509 **)&x509,
                                  (stack_st_X509 **)&ptr);
            if (iVar15 == 0) {
              uVar24 = ERR_get_error();
              ERR_error_string_n(uVar24,error_buffer_1,0x100);
              Curl_failf(local_c58,"could not parse PKCS12 file, check password, OpenSSL error %s",
                         error_buffer_1);
              PKCS12_free(p12);
              return CURLE_SSL_CERTPROBLEM;
            }
            PKCS12_free(p12);
            pSVar23 = local_c38;
            iVar15 = SSL_CTX_use_certificate(local_c38,(X509 *)x509);
            if (iVar15 == 1) {
              iVar15 = SSL_CTX_use_PrivateKey(pSVar23,(EVP_PKEY *)params.cert_id);
              if (iVar15 == 1) {
                iVar15 = SSL_CTX_check_private_key(local_c38);
                pSVar23 = local_c38;
                if (iVar15 != 0) {
                  if (ptr != (char *)0x0) {
                    do {
                      iVar15 = OPENSSL_sk_num(ptr);
                      if (iVar15 == 0) goto LAB_0041bfe9;
                      pXVar29 = (X509 *)OPENSSL_sk_pop(ptr);
                      iVar15 = SSL_CTX_add_client_CA(pSVar23,pXVar29);
                      if (iVar15 == 0) {
                        X509_free(pXVar29);
                        pcVar51 = "cannot add certificate to client CA list";
                        goto LAB_0041c034;
                      }
                      lVar59 = SSL_CTX_ctrl(pSVar23,0xe,0,pXVar29);
                    } while (lVar59 != 0);
                    X509_free(pXVar29);
                    pcVar51 = "cannot add certificate to certificate chain";
LAB_0041c034:
                    Curl_failf(local_c58,pcVar51);
                    goto LAB_0041bfbc;
                  }
LAB_0041bfe9:
                  EVP_PKEY_free((EVP_PKEY *)params.cert_id);
                  X509_free((X509 *)x509);
                  OPENSSL_sk_pop_free(ptr,X509_free);
                  bVar62 = false;
                  pCVar58 = local_c18;
                  pCVar39 = local_c58;
                  goto LAB_0041a918;
                }
                pcVar51 = 
                "private key from PKCS12 file \'%s\' does not match certificate in same file";
              }
              else {
                pcVar51 = "unable to use private key from PKCS12 file \'%s\'";
              }
            }
            else {
              uVar24 = ERR_get_error();
              local_c80 = (Curl_easy *)error_buffer_1;
              ERR_error_string_n(uVar24,(char *)local_c80,0x100);
              pcVar51 = "could not load PKCS12 client certificate, OpenSSL error %s";
            }
            Curl_failf(local_c58,pcVar51,local_c80);
LAB_0041bfbc:
            EVP_PKEY_free((EVP_PKEY *)params.cert_id);
            X509_free((X509 *)x509);
            OPENSSL_sk_pop_free(ptr,X509_free);
            return CURLE_SSL_CERTPROBLEM;
          }
          uVar24 = ERR_get_error();
          ERR_error_string_n(uVar24,error_buffer_1,0x100);
          pcVar51 = "BIO_new return NULL, OpenSSL error %s";
          pCVar39 = local_c58;
LAB_0041ac5f:
          local_c80 = (Curl_easy *)error_buffer_1;
LAB_0041ac62:
          Curl_failf(pCVar39,pcVar51,local_c80);
          return CURLE_SSL_CERTPROBLEM;
        }
        if (iVar11 == 2) {
          local_c50 = psVar28;
          iVar15 = SSL_CTX_use_certificate_file(local_c38,(char *)local_c80,2);
          pCVar39 = local_c58;
          bVar62 = true;
          if (iVar15 != 1) {
            uVar24 = ERR_get_error();
            ERR_error_string_n(uVar24,error_buffer_1,0x100);
            pcVar51 = 
            "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_0041ac5f;
          }
        }
        else if (iVar11 == 0x2a) {
          e = (ENGINE *)(local_c58->state).engine;
          local_c50 = psVar28;
          if (e == (ENGINE *)0x0) {
            _Var10 = is_pkcs11_uri((char *)local_c80);
            if ((_Var10) && (CVar12 = Curl_ossl_set_engine(pCVar39,"pkcs11"), CVar12 != CURLE_OK)) {
              return CURLE_SSL_CERTPROBLEM;
            }
            e = (ENGINE *)(pCVar39->state).engine;
            if (e == (ENGINE *)0x0) {
              pcVar51 = "crypto engine not set, can\'t load certificate";
              goto LAB_0041be60;
            }
          }
          params.cert = (X509 *)0x0;
          params.cert_id = (char *)local_c80;
          iVar15 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
          if (iVar15 == 0) {
            pcVar51 = "ssl engine does not support loading certificates";
            goto LAB_0041be60;
          }
          iVar15 = ENGINE_ctrl_cmd((ENGINE *)(pCVar39->state).engine,"LOAD_CERT_CTRL",0,&params,
                                   (f *)0x0,1);
          if (iVar15 == 0) {
            uVar24 = ERR_get_error();
            pcVar51 = error_buffer_1;
            ERR_error_string_n(uVar24,pcVar51,0x100);
            pcVar20 = "ssl engine cannot load client cert with id \'%s\' [%s]";
            goto LAB_0041b76c;
          }
          if (params.cert == (X509 *)0x0) {
            pcVar51 = "ssl engine didn\'t initialized the certificate properly.";
            goto LAB_0041be60;
          }
          iVar15 = SSL_CTX_use_certificate(local_c38,(X509 *)params.cert);
          if (iVar15 != 1) {
            Curl_failf(pCVar39,"unable to set client certificate");
            X509_free((X509 *)params.cert);
            return CURLE_SSL_CERTPROBLEM;
          }
          X509_free((X509 *)params.cert);
          bVar62 = true;
        }
        else {
          if (iVar11 != 1) {
            pcVar51 = "not supported file type \'%s\' for certificate";
            local_c80 = (Curl_easy *)local_c50;
            goto LAB_0041ac62;
          }
          local_c50 = psVar28;
          iVar15 = SSL_CTX_use_certificate_chain_file(local_c38,(char *)local_c80);
          bVar62 = true;
          if (iVar15 != 1) {
            uVar24 = ERR_get_error();
            ERR_error_string_n(uVar24,error_buffer_1,0x100);
            pcVar51 = 
            "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_0041ac5f;
          }
        }
LAB_0041a918:
        psVar28 = local_bc8;
        if (local_bc8 != (stack_st_X509 *)0x0) {
          iVar11 = do_file_type(local_bd0);
          local_c80 = (Curl_easy *)psVar28;
        }
        if (iVar11 == 0x2b) {
          if (bVar62) {
            pcVar51 = "file type P12 for private key not supported";
            goto LAB_0041be60;
          }
        }
        else if (iVar11 == 2) {
LAB_0041a967:
          iVar11 = SSL_CTX_use_PrivateKey_file(local_c38,(char *)local_c80,iVar11);
          if (iVar11 != 1) {
            pcVar51 = "PEM";
            if (local_bd0 != (char *)0x0) {
              pcVar51 = local_bd0;
            }
            pcVar20 = "unable to set private key file: \'%s\' type %s";
LAB_0041b76c:
            Curl_failf(pCVar39,pcVar20,local_c80,pcVar51);
            return CURLE_SSL_CERTPROBLEM;
          }
        }
        else if (iVar11 == 0x2a) {
          if ((pCVar39->state).engine == (void *)0x0) {
            _Var10 = is_pkcs11_uri((char *)local_c80);
            if ((_Var10) && (CVar12 = Curl_ossl_set_engine(pCVar39,"pkcs11"), CVar12 != CURLE_OK)) {
              return CURLE_SSL_CERTPROBLEM;
            }
            if ((pCVar39->state).engine == (void *)0x0) {
              pcVar51 = "crypto engine not set, can\'t load private key";
              goto LAB_0041be60;
            }
          }
          method = UI_create_method("curl user interface");
          if (method == (UI_METHOD *)0x0) {
            pcVar51 = "unable do create OpenSSL user-interface method";
            pCVar39 = local_c58;
            goto LAB_0041be60;
          }
          pUVar40 = UI_OpenSSL();
          iVar11 = UI_method_get_opener((UI *)pUVar40);
          UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar11));
          pUVar40 = UI_OpenSSL();
          iVar11 = UI_method_get_closer((UI *)pUVar40);
          UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar11));
          UI_method_set_reader(method,ssl_ui_reader);
          UI_method_set_writer(method,ssl_ui_writer);
          pEVar36 = ENGINE_load_private_key
                              ((ENGINE *)(local_c58->state).engine,(char *)local_c80,method,
                               local_c50);
          UI_destroy_method(method);
          if (pEVar36 == (EVP_PKEY *)0x0) {
            pcVar51 = "failed to load private key from crypto engine";
            pCVar39 = local_c58;
            goto LAB_0041be60;
          }
          iVar11 = SSL_CTX_use_PrivateKey(local_c38,pEVar36);
          if (iVar11 != 1) {
            Curl_failf(local_c58,"unable to set private key");
            EVP_PKEY_free(pEVar36);
            return CURLE_SSL_CERTPROBLEM;
          }
          EVP_PKEY_free(pEVar36);
          pCVar39 = local_c58;
        }
        else {
          if (iVar11 != 1) {
            pcVar51 = "not supported file type for private key";
            goto LAB_0041be60;
          }
          if (bVar62) goto LAB_0041a967;
        }
        pSVar41 = SSL_new(local_c38);
        if (pSVar41 == (SSL *)0x0) {
          pcVar51 = "unable to create an SSL structure";
          goto LAB_0041be60;
        }
        x509 = (X509 *)SSL_get_certificate(pSVar41);
        if ((X509 *)x509 != (X509 *)0x0) {
          pEVar36 = X509_get_pubkey((X509 *)x509);
          peVar42 = SSL_get_privatekey(pSVar41);
          EVP_PKEY_copy_parameters(pEVar36,peVar42);
          EVP_PKEY_free(pEVar36);
        }
        peVar42 = SSL_get_privatekey(pSVar41);
        iVar11 = EVP_PKEY_get_id(peVar42);
        pCVar39 = local_c30;
        if (iVar11 == 6) {
          r = EVP_PKEY_get1_RSA(peVar42);
          uVar16 = RSA_flags(r);
          RSA_free(r);
          SSL_free(pSVar41);
          if ((uVar16 & 1) != 0) goto LAB_0041b7e3;
        }
        else {
          SSL_free(pSVar41);
        }
        iVar11 = SSL_CTX_check_private_key(local_c38);
        if (iVar11 == 0) {
          pcVar51 = "Private key does not match the certificate public key";
          pCVar39 = local_c58;
LAB_0041be60:
          Curl_failf(pCVar39,pcVar51);
          return CURLE_SSL_CERTPROBLEM;
        }
      }
    }
LAB_0041b7e3:
    cVar17 = (conn->http_proxy).proxytype;
    if ((cVar17 != CURLPROXY_HTTPS) ||
       (lVar59 = 0x390, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0x340;
    }
    pcVar20 = *(char **)((conn->chunk).hexbuffer + lVar59 + -0x20);
    if (pcVar20 != (char *)0x0) {
      iVar11 = SSL_CTX_set_cipher_list
                         ((SSL_CTX *)
                          **(undefined8 **)
                            ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),pcVar20);
      if (iVar11 == 0) {
        pcVar51 = "failed setting cipher list: %s";
        goto LAB_0041b95d;
      }
      Curl_infof(pCVar2,"Cipher selection: %s\n",pcVar20);
      cVar17 = (conn->http_proxy).proxytype;
    }
    pBVar27 = local_c08;
    if ((cVar17 != CURLPROXY_HTTPS) ||
       (lVar59 = 0x398, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0x348;
    }
    pcVar20 = *(char **)((conn->chunk).hexbuffer + lVar59 + -0x20);
    if (pcVar20 != (char *)0x0) {
      iVar11 = SSL_CTX_set_ciphersuites
                         (**(undefined8 **)
                            ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),pcVar20);
      if (iVar11 == 0) {
        pcVar51 = "failed setting TLS 1.3 cipher suite: %s";
LAB_0041b95d:
        Curl_failf(pCVar2,pcVar51,pcVar20);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof(pCVar2,"TLS 1.3 cipher selection: %s\n",pcVar20);
    }
    iVar11 = 1;
    SSL_CTX_set_post_handshake_auth
              (**(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),1);
    pEVar36 = local_c20;
    if (pBVar27 != (BIO *)0x0 || local_c20 != (EVP_PKEY *)0x0) {
      iVar15 = SSL_CTX_load_verify_locations
                         ((SSL_CTX *)
                          **(undefined8 **)
                            ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                          (char *)pBVar27,(char *)local_c20);
      if ((iVar15 == 0) && ((char)local_bec != '\0')) {
        if (pBVar27 == (BIO *)0x0) {
          pBVar27 = (BIO *)0x49fcd3;
        }
        pEVar48 = (EVP_PKEY *)0x49fcd3;
        if (pEVar36 != (EVP_PKEY *)0x0) {
          pEVar48 = pEVar36;
        }
        Curl_failf(pCVar2,"error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                   pBVar27,pEVar48);
        return CURLE_SSL_CACERT_BADFILE;
      }
      pcVar20 = "error setting certificate verify locations, continuing anyway:\n";
      if (iVar15 != 0) {
        pcVar20 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar2,pcVar20);
      pCVar58 = local_c18;
      if (pBVar27 == (BIO *)0x0) {
        pBVar27 = (BIO *)0x49fcd3;
      }
      Curl_infof(pCVar2,"  CAfile: %s\n  CApath: %s\n",pBVar27);
    }
    if (pcVar51 != (char *)0x0) {
      pXVar44 = SSL_CTX_get_cert_store
                          ((SSL_CTX *)
                           **(undefined8 **)
                             ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)));
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar44,m);
      if ((ctx == (X509_LOOKUP *)0x0) || (iVar15 = X509_load_crl_file(ctx,pcVar51,1), iVar15 == 0))
      {
        Curl_failf(pCVar2,"error loading CRL file: %s",pcVar51);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar2,"successfully load CRL file:\n");
      pXVar44 = SSL_CTX_get_cert_store
                          ((SSL_CTX *)
                           **(undefined8 **)
                             ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)));
      X509_STORE_set_flags(pXVar44,0xc);
      Curl_infof(pCVar2,"  CRLfile: %s\n",pcVar51);
    }
    SSL_CTX_set_verify((SSL_CTX *)
                       **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                       local_bec,(callback *)0x0);
    if (keylog_file_fp != (FILE *)0x0) {
      SSL_CTX_set_keylog_callback
                (**(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
                 ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)
                 **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),0x2c,
                 0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb
              ((SSL_CTX *)
               **(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)),
               ossl_new_session_cb);
    p_Var3 = (pCVar2->set).ssl.fsslctx;
    if ((p_Var3 != (curl_ssl_ctx_callback)0x0) &&
       (CVar12 = (*p_Var3)(pCVar2,(void *)**(undefined8 **)
                                            ((long)&(pCVar61->req).writebytecount +
                                            (long)(pCVar4 + 8)),(pCVar2->set).ssl.fsslctxp),
       CVar12 != CURLE_OK)) {
      Curl_failf(pCVar2,"error signaled by ssl ctx callback");
      return CVar12;
    }
    puVar45 = *(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8));
    if ((SSL *)puVar45[1] != (SSL *)0x0) {
      SSL_free((SSL *)puVar45[1]);
      puVar45 = *(undefined8 **)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8));
    }
    pSVar41 = SSL_new((SSL_CTX *)*puVar45);
    *(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8) = pSVar41;
    if (pSVar41 == (SSL *)0x0) {
      Curl_failf(pCVar2,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar9 = (conn->proxy_ssl_config).field_0x48;
    }
    else {
      bVar9 = (conn->ssl_config).field_0x48;
    }
    if ((bVar9 & 4) != 0) {
      SSL_ctrl(pSVar41,0x41,1,(void *)0x0);
      pSVar41 = *(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8);
    }
    SSL_set_connect_state(pSVar41);
    __cp = local_c60;
    *(undefined8 *)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = 0
    ;
    iVar15 = inet_pton(2,(char *)local_c60,&addr);
    if (((iVar15 == 0) && (iVar15 = inet_pton(10,(char *)__cp,&addr), iVar15 == 0)) &&
       (lVar59 = SSL_ctrl(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                             (long)(pCVar4 + 8)) + 8),0x37,0,__cp), lVar59 == 0)) {
      Curl_infof(pCVar2,"WARNING: failed to configure server name indication (SNI) TLS extension\n")
      ;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar9 = (pCVar2->set).proxy_ssl.primary.field_0x48;
    }
    else {
      bVar9 = (pCVar2->set).ssl.primary.field_0x48;
    }
    if ((bVar9 & 8) != 0) {
      error_buffer_1[0] = '\0';
      error_buffer_1[1] = '\0';
      error_buffer_1[2] = '\0';
      error_buffer_1[3] = '\0';
      error_buffer_1[4] = '\0';
      error_buffer_1[5] = '\0';
      error_buffer_1[6] = '\0';
      error_buffer_1[7] = '\0';
      uVar16 = ossl_get_ssl_conn_index();
      uVar18 = ossl_get_ssl_sockindex_index();
      if (-1 < (int)(uVar16 | uVar18)) {
        SSL_set_ex_data(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                           (long)(pCVar4 + 8)) + 8),uVar16,conn);
        pCVar39 = local_c30;
        SSL_set_ex_data(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                           (long)(pCVar4 + 8)) + 8),uVar18,local_be0);
      }
      Curl_ssl_sessionid_lock(conn);
      _Var10 = Curl_ssl_getsessionid(conn,(void **)error_buffer_1,(size_t *)0x0,(int)local_c00);
      if (!_Var10) {
        iVar15 = SSL_set_session(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                                    (long)(pCVar4 + 8)) + 8),
                                 (SSL_SESSION *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
        if (iVar15 == 0) {
          Curl_ssl_sessionid_unlock(conn);
          uVar24 = ERR_get_error();
          ERR_error_string_n(uVar24,error_buffer,0x100);
          pcVar51 = "SSL: SSL_set_session failed: %s";
          goto LAB_0041be32;
        }
        Curl_infof(pCVar2,"SSL re-using session ID\n");
      }
      Curl_ssl_sessionid_unlock(conn);
    }
    if (((&conn->proxy_ssl[0].field_0x10)[(long)pCVar58] & 1) == 0) {
      iVar13 = SSL_set_fd(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                             (long)(pCVar4 + 8)) + 8),iVar13);
      if (iVar13 == 0) {
        uVar24 = ERR_get_error();
        ERR_error_string_n(uVar24,error_buffer,0x100);
        pcVar51 = "SSL: SSL_set_fd failed: %s";
LAB_0041be32:
        Curl_failf(pCVar2,pcVar51,error_buffer);
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    else {
      pBVar26 = BIO_f_ssl();
      pBVar27 = BIO_new(pBVar26);
      BIO_ctrl(pBVar27,0x6d,0,
               *(void **)(*(long *)((long)&(pCVar58->req).bytecount + (long)conn->local_ip) + 8));
      SSL_set_bio(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8
                           ),pBVar27,pBVar27);
    }
    *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) = 1;
    p_Var8 = local_be8;
    lVar59 = local_bd8;
  }
  while (local_bd8 = lVar59, local_be8 = p_Var8, iVar11 - 1U < 3) {
    timeout_ms = Curl_timeleft(pCVar39,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_00419222;
    uVar16 = *(uint *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8));
    if ((uVar16 & 0xfffffffe) == 2) {
      writefd = -1;
      if (uVar16 == 3) {
        writefd = (curl_socket_t)local_c48;
      }
      readfd0 = -1;
      if (uVar16 == 2) {
        readfd0 = (curl_socket_t)local_c48;
      }
      if ((char)local_c40 != '\0') {
        timeout_ms = 0;
      }
      iVar11 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar11 < 0) {
        puVar22 = (uint *)__errno_location();
        Curl_failf(pCVar39,"select/poll on SSL socket, errno: %d",(ulong)*puVar22);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar11 == 0) {
        if ((char)local_c40 != '\0') {
          *local_be8 = false;
          return CURLE_OK;
        }
        goto LAB_00419222;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar59 = 0xb40, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0xa98;
    }
    pCVar2 = conn->data;
    ERR_clear_error();
    iVar11 = SSL_connect(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                            (long)(pCVar4 + 8)) + 8));
    if (iVar11 == 1) {
      *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) = 4;
      pSVar41 = *(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8);
      pcVar51 = "";
      if (pSVar41 != (SSL *)0x0) {
        iVar11 = SSL_version(pSVar41);
        pcVar51 = "TLSv1.3";
        switch(iVar11) {
        case 0x300:
          pcVar51 = "SSLv3";
          break;
        case 0x301:
          pcVar51 = "TLSv1.0";
          break;
        case 0x302:
          pcVar51 = "TLSv1.1";
          break;
        case 0x303:
          pcVar51 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar11 == 2) {
            pcVar51 = "SSLv2";
          }
          else {
            pcVar51 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher
                    (*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8))
                              + 8));
      pcVar20 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar2,"SSL connection using %s / %s\n",pcVar51,pcVar20);
      if (((conn->bits).field_0x7 & 0x20) != 0) {
        SSL_get0_alpn_selected
                  (*(undefined8 *)
                    (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8),
                   error_buffer_1,error_buffer);
        if (error_buffer._0_4_ == 0) {
          Curl_infof(pCVar2,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar2,"ALPN, server accepted to use %.*s\n",error_buffer._0_8_ & 0xffffffff,
                     CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
          if ((error_buffer._0_4_ == 8) &&
             (*(long *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]) == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
        Curl_multiuse_state(conn,(uint)(conn->negnpn == 3) * 3 + -1);
      }
    }
    else {
      iVar11 = SSL_get_error(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                                (long)(pCVar4 + 8)) + 8),iVar11);
      if (iVar11 == 9) {
        *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) =
             1;
      }
      else if (iVar11 == 3) {
        *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) =
             3;
      }
      else {
        if (iVar11 != 2) {
          memset(error_buffer_1,0,0x100);
          *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8))
               = 1;
          uVar24 = ERR_get_error();
          uVar16 = (uint)uVar24;
          if (((-1 < (int)uVar16) && ((uVar16 & 0xff800000) == 0xa000000)) &&
             ((uVar16 & 0x7fffff) == 0x86)) {
            lVar25 = SSL_get_verify_result
                               (*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                                   (long)(pCVar4 + 8)) + 8));
            if (lVar25 == 0) {
              builtin_strncpy(error_buffer_1,"SSL certificate verification failed",0x24);
            }
            else {
              *(long *)((long)&pCVar2->next + lVar59) = lVar25;
              pcVar51 = X509_verify_cert_error_string(lVar25);
              curl_msnprintf(error_buffer_1,0x100,"SSL certificate problem: %s",pcVar51);
            }
            CVar12 = CURLE_PEER_FAILED_VERIFICATION;
LAB_0041a61f:
            Curl_failf(pCVar2,"%s",error_buffer_1);
            return CVar12;
          }
          ERR_error_string_n(uVar24,error_buffer_1,0x100);
          if (uVar24 != 0) {
            CVar12 = CURLE_SSL_CONNECT_ERROR;
            goto LAB_0041a61f;
          }
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar62 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar5 = &conn->http_proxy;
            if (bVar62) {
              ppVar5 = (proxy_info *)&conn->host;
            }
            pcVar51 = (ppVar5->host).name;
            if (!bVar62) {
              lVar59 = conn->port;
              goto LAB_0041a8c9;
            }
          }
          else {
            pcVar51 = (conn->host).name;
          }
          lVar59 = (long)conn->remote_port;
LAB_0041a8c9:
          pcVar20 = SSL_ERROR_to_str(iVar11);
          Curl_failf(pCVar2,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar20,pcVar51,
                     lVar59);
          return CURLE_SSL_CONNECT_ERROR;
        }
        *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) =
             2;
      }
    }
    iVar11 = *(int *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8));
    p_Var8 = local_be8;
    lVar59 = local_bd8;
    if (((char)local_c40 != '\0') && (iVar11 - 1U < 3)) {
      return CURLE_OK;
    }
  }
  if (iVar11 == 4) {
    cVar17 = (conn->http_proxy).proxytype;
    if (cVar17 == CURLPROXY_HTTPS) {
      iVar11 = conn->sock[1];
      pCVar39 = conn->data;
      if (conn->proxy_ssl[iVar11 != -1].state == ssl_connection_complete) {
        bVar9 = (conn->ssl_config).field_0x48;
      }
      else {
        bVar9 = (conn->proxy_ssl_config).field_0x48;
      }
      if ((bVar9 & 1) == 0) {
LAB_0041969d:
        bVar9 = (bVar9 & 2) >> 1;
        memset(&params,0,0x100);
        lVar59 = 0xa98;
        if (cVar17 != CURLPROXY_HTTPS) goto LAB_0041970a;
        iVar11 = conn->sock[1];
      }
      else {
        memset(&params,0,0x100);
        bVar9 = 1;
      }
      lVar59 = 0xb40;
      if (conn->proxy_ssl[iVar11 != -1].state == ssl_connection_complete) {
        lVar59 = 0xa98;
      }
    }
    else {
      bVar9 = (conn->ssl_config).field_0x48;
      pCVar39 = conn->data;
      if ((bVar9 & 1) == 0) goto LAB_0041969d;
      memset(&params,0,0x100);
      lVar59 = 0xa98;
      bVar9 = 1;
    }
LAB_0041970a:
    pBVar26 = BIO_s_mem();
    pBVar27 = BIO_new(pBVar26);
    if (((pCVar39->set).ssl.field_0xa0 & 1) != 0) {
      local_c18 = conn->data;
      psVar28 = SSL_get_peer_cert_chain
                          (*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                              (long)(pCVar4 + 8)) + 8));
      if (psVar28 != (stack_st_X509 *)0x0) {
        local_c50 = psVar28;
        iVar11 = OPENSSL_sk_num(psVar28);
        CVar12 = Curl_ssl_init_certinfo(local_c18,iVar11);
        if (CVar12 == CURLE_OK) {
          local_c60 = pCVar39;
          local_c08 = pBVar27;
          local_c00 = lVar59;
          pBVar26 = BIO_s_mem();
          local_c40 = BIO_new(pBVar26);
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          local_c30 = (Curl_easy *)CONCAT44(local_c30._4_4_,iVar11);
          pCVar39 = local_c18;
          for (iVar13 = 0; iVar13 != iVar11; iVar13 = iVar13 + 1) {
            local_c48 = (char *)CONCAT44(local_c48._4_4_,iVar13);
            pXVar29 = (X509 *)OPENSSL_sk_value(local_c50,iVar13);
            psig = (ASN1_BIT_STRING *)0x0;
            pXVar30 = X509_get_subject_name(pXVar29);
            pBVar27 = local_c40;
            X509_NAME_print_ex(local_c40,pXVar30,0,0x82031f);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar39,iVar13,"Subject",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            pXVar30 = X509_get_issuer_name(pXVar29);
            X509_NAME_print_ex(pBVar27,pXVar30,0,0x82031f);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            iVar11 = (curl_socket_t)local_c48;
            Curl_ssl_push_certinfo_len(pCVar39,(curl_socket_t)local_c48,"Issuer",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            uVar32 = X509_get_version(pXVar29);
            BIO_printf(pBVar27,"%lx",uVar32);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar39,iVar11,"Version",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            pAVar33 = X509_get_serialNumber(pXVar29);
            if (pAVar33->type == 0x102) {
              BIO_puts(pBVar27,"-");
            }
            for (lVar59 = 0; lVar59 < pAVar33->length; lVar59 = lVar59 + 1) {
              BIO_printf(pBVar27,"%02x",(ulong)pAVar33->data[lVar59]);
            }
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar39,(curl_socket_t)local_c48,"Serial Number",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            palg = (X509_ALGOR *)0x0;
            pAVar34 = ASN1_STRING_new();
            if (pAVar34 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&psig,&palg,pXVar29);
              X509_signature_print(pBVar27,(X509_ALGOR *)palg,pAVar34);
              ASN1_STRING_free(pAVar34);
              if (palg != (X509_ALGOR *)0x0) {
                i2a_ASN1_OBJECT(pBVar27,(ASN1_OBJECT *)palg->algorithm);
                sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
                Curl_ssl_push_certinfo_len
                          (pCVar39,(curl_socket_t)local_c48,"Public Key Algorithm",ptr,sVar31);
                BIO_ctrl(pBVar27,1,0,(void *)0x0);
              }
            }
            uVar32 = X509_get0_extensions(pXVar29);
            iVar11 = OPENSSL_sk_num(uVar32);
            if (0 < iVar11) {
              for (iVar11 = 0; iVar13 = OPENSSL_sk_num(uVar32), iVar11 < iVar13; iVar11 = iVar11 + 1
                  ) {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar32,iVar11);
                pBVar26 = BIO_s_mem();
                pBVar27 = BIO_new(pBVar26);
                if (pBVar27 == (BIO *)0x0) break;
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)&addr,0x80,a);
                iVar13 = X509V3_EXT_print(pBVar27,ex,0,0);
                if (iVar13 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(pBVar27,v);
                }
                BIO_ctrl(pBVar27,0x73,0,&x509);
                pcVar51 = error_buffer;
                uVar24 = 0;
                while (pCVar39 = local_c18, uVar53 = *(ulong *)x509, uVar24 < uVar53) {
                  bVar62 = *(char *)(*(long *)(x509 + 8) + uVar24) == '\n';
                  pcVar20 = "";
                  if (bVar62) {
                    pcVar20 = ", ";
                  }
                  uVar24 = uVar24 + bVar62;
                  if (uVar53 <= uVar24) {
                    uVar53 = uVar24;
                  }
                  for (; uVar53 != uVar24; uVar24 = uVar24 + 1) {
                    if (*(char *)(*(long *)(x509 + 8) + uVar24) != ' ') {
                      iVar13 = curl_msnprintf(pcVar51,(size_t)(error_buffer_1 + -(long)pcVar51),
                                              "%s%c",pcVar20);
                      pcVar51 = pcVar51 + iVar13;
                      uVar53 = uVar24;
                      break;
                    }
                  }
                  uVar24 = uVar53 + 1;
                }
                Curl_ssl_push_certinfo
                          (local_c18,(curl_socket_t)local_c48,(char *)&addr,error_buffer);
                BIO_free(pBVar27);
              }
            }
            pAVar35 = (ASN1_TIME *)X509_get0_notBefore(pXVar29);
            pBVar27 = local_c40;
            ASN1_TIME_print(local_c40,pAVar35);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            iVar11 = (curl_socket_t)local_c48;
            Curl_ssl_push_certinfo_len(pCVar39,(curl_socket_t)local_c48,"Start date",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            pAVar35 = (ASN1_TIME *)X509_get0_notAfter(pXVar29);
            ASN1_TIME_print(pBVar27,pAVar35);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar39,iVar11,"Expire date",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            pEVar36 = X509_get_pubkey(pXVar29);
            if (pEVar36 == (EVP_PKEY *)0x0) {
              Curl_infof(pCVar39,"   Unable to load public key\n");
            }
            else {
              iVar11 = EVP_PKEY_get_id(pEVar36);
              if (iVar11 == 0x74) {
                uVar32 = EVP_PKEY_get0_DSA(pEVar36);
                local_c20 = pEVar36;
                DSA_get0_pqg(uVar32,error_buffer,&addr,&x509);
                DSA_get0_key(uVar32,&palg,0);
                pBVar27 = local_c40;
                iVar11 = (curl_socket_t)local_c48;
                pubkey_show(pCVar39,(BIO *)local_c40,(curl_socket_t)local_c48,"dsa","p",
                            (BIGNUM *)error_buffer._0_8_);
                pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,"dsa","q",(BIGNUM *)addr.__in6_u._0_8_);
                pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,"dsa","g",(BIGNUM *)x509);
                pcVar51 = "dsa";
LAB_00419eef:
                pcVar20 = "pub_key";
                uVar32 = palg;
LAB_00419ef6:
                pEVar36 = local_c20;
                pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,pcVar51,pcVar20,(BIGNUM *)uVar32);
              }
              else {
                if (iVar11 == 0x1c) {
                  uVar32 = EVP_PKEY_get0_DH(pEVar36);
                  local_c20 = pEVar36;
                  DH_get0_pqg(uVar32,error_buffer,&addr,&x509);
                  DH_get0_key(uVar32,&palg,0);
                  pBVar27 = local_c40;
                  iVar11 = (curl_socket_t)local_c48;
                  pubkey_show(pCVar39,(BIO *)local_c40,(curl_socket_t)local_c48,"dh","p",
                              (BIGNUM *)error_buffer._0_8_);
                  pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,"dh","q",(BIGNUM *)addr.__in6_u._0_8_);
                  pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,"dh","g",(BIGNUM *)x509);
                  pcVar51 = "dh";
                  goto LAB_00419eef;
                }
                if (iVar11 == 6) {
                  uVar32 = EVP_PKEY_get0_RSA(pEVar36);
                  RSA_get0_key(uVar32,error_buffer,&addr,0);
                  pBVar27 = local_c40;
                  local_c20 = pEVar36;
                  BN_print(local_c40,(BIGNUM *)error_buffer._0_8_);
                  sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
                  iVar11 = (curl_socket_t)local_c48;
                  Curl_ssl_push_certinfo_len
                            (pCVar39,(curl_socket_t)local_c48,"RSA Public Key",ptr,sVar31);
                  BIO_ctrl(pBVar27,1,0,(void *)0x0);
                  pubkey_show(pCVar39,(BIO *)pBVar27,iVar11,"rsa","n",(BIGNUM *)error_buffer._0_8_);
                  pcVar51 = "rsa";
                  pcVar20 = "e";
                  uVar32 = addr.__in6_u._0_8_;
                  goto LAB_00419ef6;
                }
              }
              EVP_PKEY_free(pEVar36);
            }
            if (psig != (ASN1_BIT_STRING *)0x0) {
              for (lVar59 = 0; pBVar27 = local_c40, lVar59 < psig->length; lVar59 = lVar59 + 1) {
                BIO_printf(local_c40,"%02x:",(ulong)psig->data[lVar59]);
              }
              sVar31 = BIO_ctrl(local_c40,3,0,&ptr);
              Curl_ssl_push_certinfo_len(pCVar39,(curl_socket_t)local_c48,"Signature",ptr,sVar31);
              BIO_ctrl(pBVar27,1,0,(void *)0x0);
            }
            pBVar27 = local_c40;
            PEM_write_bio_X509(local_c40,pXVar29);
            sVar31 = BIO_ctrl(pBVar27,3,0,&ptr);
            iVar13 = (curl_socket_t)local_c48;
            Curl_ssl_push_certinfo_len(pCVar39,(curl_socket_t)local_c48,"Cert",ptr,sVar31);
            BIO_ctrl(pBVar27,1,0,(void *)0x0);
            iVar11 = (int)local_c30;
          }
          BIO_free(local_c40);
          pBVar27 = local_c08;
          pCVar39 = local_c60;
          lVar59 = local_c00;
        }
      }
    }
    lVar25 = SSL_get1_peer_certificate
                       (*(undefined8 *)
                         (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 8))
    ;
    *(long *)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = lVar25;
    if (lVar25 == 0) {
      BIO_free(pBVar27);
      if (bVar9 != 0) {
        Curl_failf(pCVar39,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar51 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar51 = "Server";
        }
      }
      else {
        pcVar51 = "Server";
      }
      local_c00 = lVar59;
      Curl_infof(pCVar39,"%s certificate:\n",pcVar51);
      pXVar30 = X509_get_subject_name
                          (*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                               (long)(pCVar4 + 8)) + 0x10));
      iVar11 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer_1,size);
      pcVar51 = "[NONE]";
      if (iVar11 == 0) {
        pcVar51 = error_buffer_1;
      }
      Curl_infof(pCVar39," subject: %s\n",pcVar51);
      pAVar35 = (ASN1_TIME *)
                X509_get0_notBefore(*(undefined8 *)
                                     (*(long *)((long)&(pCVar61->req).writebytecount +
                                               (long)(pCVar4 + 8)) + 0x10));
      ASN1_TIME_print(pBVar27,pAVar35);
      local_c60 = pCVar39;
      lVar59 = BIO_ctrl(pBVar27,3,0,&local_bc0);
      Curl_infof(local_c60," start date: %.*s\n",lVar59);
      BIO_ctrl(pBVar27,1,0,(void *)0x0);
      pAVar35 = (ASN1_TIME *)
                X509_get0_notAfter(*(undefined8 *)
                                    (*(long *)((long)&(pCVar61->req).writebytecount +
                                              (long)(pCVar4 + 8)) + 0x10));
      ASN1_TIME_print(pBVar27,pAVar35);
      pCVar39 = local_c60;
      lVar59 = BIO_ctrl(pBVar27,3,0,&local_bc0);
      Curl_infof(pCVar39," expire date: %.*s\n",lVar59);
      BIO_ctrl(pBVar27,1,0,(void *)0x0);
      BIO_free(pBVar27);
      cVar17 = (conn->http_proxy).proxytype;
      if ((cVar17 == CURLPROXY_HTTPS) &&
         (iVar11 = conn->sock[1], conn->proxy_ssl[iVar11 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x48 & 2) != 0) {
          pXVar29 = *(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8))
                              + 0x10);
          local_c80 = conn->data;
LAB_0041a29f:
          bVar62 = conn->proxy_ssl[iVar11 != -1].state == ssl_connection_complete;
          ppVar5 = &conn->http_proxy;
          if (bVar62) {
            ppVar5 = (proxy_info *)&conn->host;
          }
          ppcVar37 = &(ppVar5->host).name;
          lVar59 = 0x168;
          if (bVar62) {
            lVar59 = 0xd8;
          }
LAB_0041a2e2:
          pCVar39 = (Curl_easy *)*ppcVar37;
          local_c50 = *(stack_st_X509 **)((conn->chunk).hexbuffer + lVar59 + -0x20);
          local_c30 = pCVar39;
          if ((((conn->bits).field_0x5 & 2) == 0) ||
             (iVar11 = inet_pton(10,(char *)pCVar39,error_buffer), iVar11 == 0)) {
            iVar11 = inet_pton(2,(char *)pCVar39,error_buffer);
            local_c18 = (Curl_easy *)(ulong)((uint)(iVar11 != 0) * 4);
            iVar11 = (uint)(iVar11 != 0) * 5 + 2;
          }
          else {
            iVar11 = 7;
            local_c18 = (Curl_easy *)&DAT_00000010;
          }
          pcVar51 = (char *)0x0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar29,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            local_c08 = (BIO *)CONCAT44(local_c08._4_4_,0x3c);
            local_be0 = pXVar29;
            uVar14 = OPENSSL_sk_num(a_00);
            local_c40 = (BIO *)CONCAT44(local_c40._4_4_,uVar14);
            iVar13 = 0;
            bVar60 = false;
            local_c20 = (EVP_PKEY *)0x0;
            local_c48 = (char *)0x0;
            bVar62 = false;
            while ((iVar13 < (int)local_c40 && (!bVar60))) {
              piVar38 = (int *)OPENSSL_sk_value(a_00,iVar13);
              iVar15 = *piVar38;
              if (iVar15 == 2) {
                bVar62 = true;
              }
              else if (iVar15 == 7) {
                pcVar51 = (char *)CONCAT71((int7)((ulong)pcVar51 >> 8),1);
                local_c48 = pcVar51;
              }
              if (iVar15 == iVar11) {
                pcVar20 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar38 + 2));
                iVar15 = ASN1_STRING_length(*(ASN1_STRING **)(piVar38 + 2));
                if (iVar11 == 7) {
                  if (local_c18 != (Curl_easy *)(long)iVar15) goto LAB_0041a47b;
                  iVar15 = bcmp(pcVar20,error_buffer,(size_t)local_c18);
                  if (iVar15 == 0) {
                    bVar60 = false;
                    Curl_infof(local_c80,
                               " subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                               local_c50);
                    local_c20 = (EVP_PKEY *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  else {
LAB_0041a476:
                    bVar60 = false;
                  }
                }
                else {
                  if ((iVar11 != 2) ||
                     (pCVar39 = (Curl_easy *)strlen(pcVar20), pCVar39 != (Curl_easy *)(long)iVar15))
                  goto LAB_0041a47b;
                  iVar15 = Curl_cert_hostcheck(pcVar20,(char *)local_c30);
                  if (iVar15 == 0) goto LAB_0041a476;
                  Curl_infof(local_c80," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             local_c50,pcVar20);
                  bVar60 = true;
                  pcVar51 = pcVar20;
                }
              }
              else {
LAB_0041a47b:
                bVar60 = false;
              }
              iVar13 = iVar13 + 1;
            }
            GENERAL_NAMES_free(a_00);
            psVar28 = local_c50;
            pCVar39 = local_c60;
            if (bVar60 || ((ulong)local_c20 & 1) != 0) goto LAB_0041af44;
            pXVar29 = local_be0;
            if (bVar62 || ((ulong)local_c48 & 1) != 0) {
              Curl_infof(local_c80," subjectAltName does not match %s\n",local_c50);
              Curl_failf(local_c80,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,psVar28);
              goto LAB_0041af20;
            }
          }
          addr.__in6_u._0_8_ = (long)"PK\x01\x02" + 4;
          pXVar30 = X509_get_subject_name(pXVar29);
          if (pXVar30 == (X509_NAME *)0x0) {
LAB_0041ae7b:
            pCVar39 = local_c60;
            if ((char *)addr.__in6_u._0_8_ == "") {
              addr.__in6_u._0_8_ = 0;
              goto LAB_0041aed8;
            }
            if (addr.__in6_u._0_8_ == 0) goto LAB_0041aed8;
            iVar11 = Curl_cert_hostcheck((char *)addr.__in6_u._0_8_,(char *)local_c30);
            if (iVar11 == 0) {
              Curl_failf(local_c80,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,addr.__in6_u._0_8_,local_c50);
              goto LAB_0041aeeb;
            }
            Curl_infof(local_c80," common name: %s (matched)\n");
            iVar11 = 0;
          }
          else {
            iVar11 = -1;
            do {
              iVar13 = iVar11;
              iVar11 = X509_NAME_get_index_by_NID(pXVar30,0xd,iVar13);
            } while (-1 < iVar11);
            if (iVar13 < 0) goto LAB_0041ae7b;
            ne = X509_NAME_get_entry(pXVar30,iVar13);
            pAVar34 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar34 == (ASN1_STRING *)0x0) goto LAB_0041ae7b;
            iVar11 = ASN1_STRING_type(pAVar34);
            if (iVar11 == 0xc) {
              uVar16 = ASN1_STRING_length(pAVar34);
              if ((int)uVar16 < 0) {
                uVar32 = "";
              }
              else {
                uVar32 = CRYPTO_malloc(uVar16 + 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmcurl/lib/vtls/openssl.c"
                                       ,0x66c);
                addr.__in6_u._0_8_ = uVar32;
                if ((char *)uVar32 == (char *)0x0) goto LAB_0041aed8;
                __src = (void *)ASN1_STRING_get0_data(pAVar34);
                memcpy((void *)uVar32,__src,(ulong)uVar16);
                *(char *)(uVar32 + (ulong)uVar16) = '\0';
              }
LAB_0041ae63:
              uznum = strlen((char *)uVar32);
              uVar18 = curlx_uztosi(uznum);
              if (uVar18 == uVar16) goto LAB_0041ae7b;
              Curl_failf(local_c80,"SSL: illegal cert name field");
              iVar11 = 0x3c;
              pCVar39 = local_c60;
              if ((char *)addr.__in6_u._0_8_ == "") {
                local_c08 = (BIO *)CONCAT44(local_c08._4_4_,0x3c);
                goto LAB_0041af20;
              }
              goto LAB_0041aefb;
            }
            uVar16 = ASN1_STRING_to_UTF8((uchar **)&addr,pAVar34);
            uVar32 = addr.__in6_u._0_8_;
            if (addr.__in6_u._0_8_ != 0) goto LAB_0041ae63;
LAB_0041aed8:
            pCVar39 = local_c60;
            Curl_failf(local_c80,"SSL: unable to obtain common name from peer certificate");
LAB_0041aeeb:
            iVar11 = 0x3c;
          }
LAB_0041aefb:
          if (addr.__in6_u._0_8_ != 0) {
            CRYPTO_free((void *)addr.__in6_u._0_8_);
          }
          local_c08 = (BIO *)CONCAT44(local_c08._4_4_,iVar11);
          if (iVar11 != 0) {
LAB_0041af20:
            X509_free(*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)
                                          ) + 0x10));
            *(undefined8 *)
             (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = 0;
            return (CURLcode)local_c08;
          }
        }
      }
      else if (((conn->ssl_config).field_0x48 & 2) != 0) {
        pXVar29 = *(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) +
                            0x10);
        local_c80 = conn->data;
        if (cVar17 == CURLPROXY_HTTPS) {
          iVar11 = conn->sock[1];
          goto LAB_0041a29f;
        }
        ppcVar37 = &(conn->host).name;
        lVar59 = 0xd8;
        goto LAB_0041a2e2;
      }
LAB_0041af44:
      pXVar30 = X509_get_issuer_name
                          (*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                               (long)(pCVar4 + 8)) + 0x10));
      iVar11 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer_1,size_00);
      if (iVar11 == 0) {
        Curl_infof(pCVar39," issuer: %s\n",error_buffer_1);
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar51 = (pCVar39->set).proxy_ssl.issuercert;
        }
        else {
          pcVar51 = (pCVar39->set).ssl.issuercert;
        }
        if (pcVar51 != (char *)0x0) {
          pBVar26 = BIO_s_file();
          pBVar27 = BIO_new(pBVar26);
          if (pBVar27 == (BIO *)0x0) {
            uVar24 = ERR_get_error();
            ERR_error_string_n(uVar24,(char *)&params,0x100);
            Curl_failf(pCVar39,"BIO_new return NULL, OpenSSL error %s",&params);
            X509_free(*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)
                                          ) + 0x10));
            *(undefined8 *)
             (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = 0;
            return CURLE_OUT_OF_MEMORY;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar59 = 0xb50, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar59 = 0xaa8;
          }
          lVar59 = BIO_ctrl(pBVar27,0x6c,3,*(void **)((long)&pCVar39->next + lVar59));
          if ((int)lVar59 < 1) {
            if (bVar9 != 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xaa8;
              }
              Curl_failf(pCVar39,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)&pCVar39->next + lVar59));
            }
            BIO_free(pBVar27);
            goto LAB_0041b580;
          }
          pXVar29 = PEM_read_bio_X509(pBVar27,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar29 == (X509 *)0x0) {
            if (bVar9 != 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xaa8;
              }
              Curl_failf(pCVar39,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)&pCVar39->next + lVar59));
            }
            BIO_free(pBVar27);
            pXVar29 = (X509 *)0x0;
          }
          else {
            iVar11 = X509_check_issued(pXVar29,*(X509 **)(*(long *)((long)&(pCVar61->req).
                                                                           writebytecount +
                                                                   (long)(pCVar4 + 8)) + 0x10));
            if (iVar11 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xaa8;
              }
              Curl_infof(pCVar39," SSL certificate issuer check ok (%s)\n",
                         *(undefined8 *)((long)&pCVar39->next + lVar59));
              BIO_free(pBVar27);
              X509_free(pXVar29);
              goto LAB_0041b66c;
            }
            if (bVar9 != 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xaa8;
              }
              Curl_failf(pCVar39,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)&pCVar39->next + lVar59));
            }
            BIO_free(pBVar27);
          }
          X509_free(pXVar29);
LAB_0041b580:
          X509_free(*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8))
                              + 0x10));
          *(undefined8 *)
           (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = 0;
          return CURLE_SSL_ISSUER_ERROR;
        }
LAB_0041b66c:
        lVar59 = SSL_get_verify_result
                           (*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                               (long)(pCVar4 + 8)) + 8));
        *(long *)((long)&pCVar39->next + local_c00) = lVar59;
        if (lVar59 == 0) {
          CVar12 = CURLE_OK;
          Curl_infof(pCVar39," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            bVar1 = (conn->proxy_ssl_config).field_0x48;
          }
          else {
            bVar1 = (conn->ssl_config).field_0x48;
          }
          if ((bVar1 & 1) == 0) {
            pcVar51 = X509_verify_cert_error_string(lVar59);
            CVar12 = CURLE_OK;
            Curl_infof(local_c60," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                       pcVar51,lVar59);
          }
          else {
            CVar12 = CURLE_PEER_FAILED_VERIFICATION;
            if (bVar9 != 0) {
              pcVar51 = X509_verify_cert_error_string(lVar59);
              Curl_failf(local_c60,"SSL certificate verify result: %s (%ld)",pcVar51,lVar59);
            }
          }
        }
      }
      else {
        CVar12 = CURLE_PEER_FAILED_VERIFICATION;
        if (bVar9 != 0) {
          Curl_failf(local_c60,"SSL: couldn\'t get X509-issuer name!");
        }
      }
      cVar17 = (conn->http_proxy).proxytype;
      if ((cVar17 == CURLPROXY_HTTPS) &&
         (iVar11 = conn->sock[1], conn->proxy_ssl[iVar11 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x48 & 4) != 0) {
LAB_0041b02c:
          pCVar39 = conn->data;
          lVar59 = SSL_ctrl(*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                               (long)(pCVar4 + 8)) + 8),0x46,0,error_buffer);
          if (error_buffer._0_8_ == 0) {
            pcVar51 = "No OCSP response received";
LAB_0041b1c1:
            resp = (OCSP_RESPONSE *)0x0;
            Curl_failf(pCVar39,pcVar51);
LAB_0041b1ce:
            CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            addr.__in6_u._0_1_ = error_buffer[0];
            addr.__in6_u._1_1_ = error_buffer[1];
            addr.__in6_u._2_1_ = error_buffer[2];
            addr.__in6_u._3_1_ = error_buffer[3];
            addr.__in6_u._4_1_ = error_buffer[4];
            addr.__in6_u._5_1_ = error_buffer[5];
            addr.__in6_u._6_1_ = error_buffer[6];
            addr.__in6_u._7_1_ = error_buffer[7];
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&addr,lVar59);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar51 = "Invalid OCSP response";
              goto LAB_0041b1c1;
            }
            uVar16 = OCSP_response_status(resp);
            if (uVar16 != 0) {
              pcVar51 = OCSP_response_status_str((long)(int)uVar16);
              Curl_failf(pCVar39,"Invalid OCSP response status: %s (%d)",pcVar51,(ulong)uVar16);
              goto LAB_0041b1ce;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              Curl_failf(pCVar39,"Invalid OCSP response");
              CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              psVar28 = SSL_get_peer_cert_chain
                                  (*(SSL **)(*(long *)((long)&(pCVar61->req).writebytecount +
                                                      (long)(pCVar4 + 8)) + 8));
              pXVar44 = SSL_CTX_get_cert_store
                                  ((SSL_CTX *)
                                   **(undefined8 **)
                                     ((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)));
              iVar11 = OCSP_basic_verify(bs,psVar28,pXVar44,0);
              if (iVar11 < 1) {
                Curl_failf(pCVar39,"OCSP response verification failed");
                CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                for (iVar11 = 0; iVar13 = OCSP_resp_count(bs), iVar11 < iVar13; iVar11 = iVar11 + 1)
                {
                  single = OCSP_resp_get0(bs,iVar11);
                  if (single != (OCSP_SINGLERESP *)0x0) {
                    uVar16 = OCSP_single_get0_status
                                       (single,(int *)&palg,(ASN1_GENERALIZEDTIME **)&x509,
                                        (ASN1_GENERALIZEDTIME **)&ptr,(ASN1_GENERALIZEDTIME **)&psig
                                       );
                    iVar13 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)ptr,
                                                 (ASN1_GENERALIZEDTIME *)psig,300,-1);
                    if (iVar13 == 0) {
                      Curl_failf(pCVar39,"OCSP response has expired");
                    }
                    else {
                      pcVar51 = OCSP_cert_status_str((long)(int)uVar16);
                      Curl_infof(pCVar39,"SSL certificate status: %s (%d)\n",pcVar51,(ulong)uVar16);
                      if (uVar16 != 2) {
                        if (uVar16 != 1) goto LAB_0041b4a9;
                        pcVar51 = OCSP_crl_reason_str((long)(int)palg);
                        Curl_failf(pCVar39,"SSL certificate revocation reason: %s (%d)",pcVar51,
                                   (ulong)palg & 0xffffffff);
                      }
                    }
                    CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                    goto LAB_0041bf4c;
                  }
LAB_0041b4a9:
                }
                CVar12 = CURLE_OK;
              }
LAB_0041bf4c:
              OCSP_BASICRESP_free(bs);
            }
          }
          OCSP_RESPONSE_free(resp);
          if (CVar12 != CURLE_OK) {
            X509_free(*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)
                                          ) + 0x10));
            *(undefined8 *)
             (*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) = 0;
            return CVar12;
          }
          cVar17 = (conn->http_proxy).proxytype;
          CVar12 = CURLE_OK;
          goto LAB_0041b205;
        }
        CVar19 = CURLE_OK;
        if (bVar9 != 0) {
          CVar19 = CVar12;
        }
LAB_0041b220:
        lVar59 = (ulong)(conn->proxy_ssl[iVar11 != -1].state != ssl_connection_complete) * 8 + 0xd10
        ;
      }
      else {
        if (((conn->ssl_config).field_0x48 & 4) != 0) goto LAB_0041b02c;
LAB_0041b205:
        CVar19 = CURLE_OK;
        if (bVar9 != 0) {
          CVar19 = CVar12;
        }
        lVar59 = 0xd10;
        if (cVar17 == CURLPROXY_HTTPS) {
          iVar11 = conn->sock[1];
          goto LAB_0041b220;
        }
      }
      pcVar51 = *(char **)((long)&local_c60->next + lVar59);
      local_bc0 = pcVar51;
      if ((CVar19 == CURLE_OK) && (pcVar51 != (char *)0x0)) {
        lVar59 = *(long *)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) +
                          0x10);
        if (lVar59 == 0) {
LAB_0041b31b:
          CVar19 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          pCVar39 = local_c60;
        }
        else {
          pXVar43 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar59);
          uVar16 = i2d_X509_PUBKEY(pXVar43,(uchar **)0x0);
          if ((int)uVar16 < 1) goto LAB_0041b31b;
          uVar24 = (ulong)uVar16;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar24);
          error_buffer._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_0041b31b;
          pXVar43 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar59);
          uVar18 = i2d_X509_PUBKEY(pXVar43,(uchar **)error_buffer);
          pCVar39 = local_c60;
          if ((error_buffer._0_8_ == 0 || uVar16 != uVar18) ||
              error_buffer._0_8_ - (long)pubkey != uVar24) {
            CVar19 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar19 = Curl_pin_peer_pubkey(local_c60,pcVar51,pubkey,uVar24);
          }
          (*Curl_cfree)(pubkey);
          if (CVar19 == CURLE_OK) {
            CVar19 = CURLE_OK;
            goto LAB_0041b339;
          }
        }
        Curl_failf(pCVar39,"SSL: public key does not match pinned public key!");
      }
LAB_0041b339:
      X509_free(*(X509 **)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) +
                          0x10));
      *(undefined8 *)(*(long *)((long)&(pCVar61->req).writebytecount + (long)(pCVar4 + 8)) + 0x10) =
           0;
      *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) = 5;
      if (CVar19 != CURLE_OK) {
        return CVar19;
      }
    }
  }
  else if (iVar11 != 5) {
    _Var10 = false;
    goto LAB_004194a7;
  }
  *(undefined4 *)((long)(pCVar4 + 8) + (long)&(pCVar61->req).bytecount) = 2;
  conn->recv[local_bd8] = ossl_recv;
  conn->send[local_bd8] = ossl_send;
  _Var10 = true;
LAB_004194a7:
  *local_be8 = _Var10;
  *(undefined4 *)((undefined1 *)((long)&(pCVar61->req).bytecount + 4) + (long)(pCVar4 + 8)) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}